

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parser.cpp
# Opt level: O3

ptr<Expression> __thiscall Parser::call(Parser *this,ptr<Expression> *callee)

{
  shared_ptr<Expression> *in_RDX;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  ptr<Expression> pVar1;
  ExpressionList exprList;
  undefined1 local_51;
  Call *local_50;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_48;
  Call *local_40;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_38;
  ExpressionList local_30;
  
  consume((Parser *)callee);
  expressionList(&local_30,(Parser *)callee);
  consume((Parser *)callee,RightParen,"\')\'");
  local_40 = (Call *)0x0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<Call,std::allocator<Call>,std::shared_ptr<Expression>&,std::vector<std::shared_ptr<Expression>,std::allocator<std::shared_ptr<Expression>>>&>
            (&local_38,&local_40,(allocator<Call> *)&local_51,in_RDX,&local_30);
  local_50 = local_40;
  local_48 = local_38._M_pi;
  if (local_38._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      (local_38._M_pi)->_M_use_count = (local_38._M_pi)->_M_use_count + 1;
      UNLOCK();
    }
    else {
      (local_38._M_pi)->_M_use_count = (local_38._M_pi)->_M_use_count + 1;
    }
  }
  postfix(this,callee);
  if (local_48 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_48);
  }
  if (local_38._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_38._M_pi);
  }
  std::vector<std::shared_ptr<Expression>,_std::allocator<std::shared_ptr<Expression>_>_>::~vector
            (&local_30);
  pVar1.super___shared_ptr<Expression,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       extraout_RDX._M_pi;
  pVar1.super___shared_ptr<Expression,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)this;
  return (ptr<Expression>)pVar1.super___shared_ptr<Expression,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

ptr<Expression> Parser::call(ptr<Expression> callee) {
    consume();
    ExpressionList exprList = expressionList();
    consume(TokenType::RightParen, "')'");

    ptr<Expression> expr = make<Call>(callee, exprList);
    return postfix(expr);
}